

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_enumerate(char *args)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  
  pcVar5 = args;
  if (*args == '\"') {
    pcVar5 = args + 1;
    sVar2 = strlen(pcVar5);
    args[sVar2] = '\0';
  }
  puVar3 = (undefined8 *)PHYSFS_enumerateFiles(pcVar5);
  if (puVar3 == (undefined8 *)0x0) {
    uVar4 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar4);
  }
  else {
    uVar6 = 0;
    pcVar5 = (char *)*puVar3;
    while (pcVar5 != (char *)0x0) {
      puts(pcVar5);
      lVar1 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      pcVar5 = (char *)puVar3[lVar1];
    }
    printf("\n total (%d) files.\n",uVar6 & 0xffffffff);
    PHYSFS_freeList(puVar3);
  }
  return 1;
}

Assistant:

static int cmd_enumerate(char *args)
{
    char **rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_enumerateFiles(args);

    if (rc == NULL)
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());
    else
    {
        int file_count;
        char **i;
        for (i = rc, file_count = 0; *i != NULL; i++, file_count++)
            printf("%s\n", *i);

        printf("\n total (%d) files.\n", file_count);
        PHYSFS_freeList(rc);
    } /* else */

    return 1;
}